

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

ThreadPool * ThreadPool::instance(void)

{
  int concurrentJobs;
  ThreadPool *this;
  
  if (sInstance == (ThreadPool *)0x0) {
    this = (ThreadPool *)operator_new(0xd8);
    concurrentJobs = idealThreadCount();
    ThreadPool(this,concurrentJobs,Normal,0);
    sInstance = this;
  }
  return sInstance;
}

Assistant:

ThreadPool* ThreadPool::instance()
{
    if (!sInstance)
        sInstance = new ThreadPool(idealThreadCount());
    return sInstance;
}